

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lwsac.c
# Opt level: O0

uint8_t * lwsac_scan_extant(lwsac *head,uint8_t *find,size_t len,int nul)

{
  long lVar1;
  int iVar2;
  uint8_t *end;
  uint8_t *pos;
  int nul_local;
  size_t len_local;
  uint8_t *find_local;
  lwsac *head_local;
  
  find_local = (uint8_t *)head;
  do {
    if (find_local == (uint8_t *)0x0) {
      return (uint8_t *)0x0;
    }
    end = find_local + 0x20;
    lVar1 = *(long *)(find_local + 0x18);
    if (len <= *(long *)(find_local + 0x18) - 0x20U) {
      for (; end < find_local + (lVar1 - len); end = end + 1) {
        if (((*end == *find) &&
            (((nul == 0 || (end[len] == '\0')) && (end[len - 1] == find[len - 1])))) &&
           (iVar2 = memcmp(end,find,len), iVar2 == 0)) {
          return end;
        }
      }
    }
    find_local = *(uint8_t **)find_local;
  } while( true );
}

Assistant:

uint8_t *
lwsac_scan_extant(struct lwsac *head, uint8_t *find, size_t len, int nul)
{
	while (head) {
		uint8_t *pos = (uint8_t *)&head[1],
			*end = ((uint8_t *)head) + head->ofs - len;

		if (head->ofs - sizeof(*head) >= len)
			while (pos < end) {
				if (*pos == *find && (!nul || !pos[len]) &&
				    pos[len - 1] == find[len - 1] &&
				    !memcmp(pos, find, len))
					/* found the blob */
					return pos;
				pos++;
			}

		head = head->next;
	}

	return NULL;
}